

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_assert.h
# Opt level: O0

void TestEq<int,unsigned_long>(int expval,unsigned_long val,char *file,int line,char *func)

{
  char *expval_00;
  char *val_00;
  string local_390 [32];
  string local_370 [32];
  stringstream local_350 [8];
  stringstream ss2;
  ostream local_340 [392];
  stringstream local_1b8 [8];
  stringstream ss1;
  ostream local_1a8 [376];
  char *local_30;
  char *func_local;
  char *pcStack_20;
  int line_local;
  char *file_local;
  unsigned_long val_local;
  int expval_local;
  
  if ((long)expval == val) {
    testing_success = testing_success + 1;
  }
  else {
    local_30 = func;
    func_local._4_4_ = line;
    pcStack_20 = file;
    file_local = (char *)val;
    val_local._4_4_ = expval;
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::ostream::operator<<(local_1a8,val_local._4_4_);
    std::__cxx11::stringstream::stringstream(local_350);
    std::ostream::operator<<(local_340,(ulong)file_local);
    std::__cxx11::stringstream::str();
    expval_00 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    val_00 = (char *)std::__cxx11::string::c_str();
    TestFail(expval_00,val_00,pcStack_20,func_local._4_4_,local_30);
    std::__cxx11::string::~string(local_390);
    std::__cxx11::string::~string(local_370);
    std::__cxx11::stringstream::~stringstream(local_350);
    std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  return;
}

Assistant:

void TestEq(T expval, U val, const char *file, int line, const char *func = 0)
  {
  if (U(expval) != val)
    {
    std::stringstream ss1;
    ss1 << expval;
    std::stringstream ss2;
    ss2 << val;
    TestFail(ss1.str().c_str(), ss2.str().c_str(), file, line, func);
    }
  else
    ++testing_success;
  }